

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xpath_query::evaluate_boolean(xpath_query *this,xpath_node *n)

{
  bool bVar1;
  xpath_context c;
  xpath_stack_data sd;
  xpath_context local_2098;
  xpath_memory_block local_2078;
  xpath_memory_block local_1068;
  xpath_allocator local_58;
  xpath_allocator local_40;
  xpath_stack local_28;
  bool local_18 [8];
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    bVar1 = false;
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_28.result = &local_58;
    local_58._error = local_18;
    local_58._root = &local_2078;
    local_58._root_size = 0;
    local_28.temp = &local_40;
    local_40._root = &local_1068;
    local_40._root_size = 0;
    local_18[0] = false;
    local_1068.next = (xpath_memory_block *)0x0;
    local_2078.next = (xpath_memory_block *)0x0;
    local_1068.capacity = 0x1000;
    local_2078.capacity = 0x1000;
    local_40._error = local_58._error;
    bVar1 = impl::anon_unknown_0::xpath_ast_node::eval_boolean(*this->_impl,&local_2098,&local_28);
    bVar1 = (bool)((local_18[0] ^ 1U) & bVar1);
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_58._root);
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_40._root);
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xpath_query::evaluate_boolean(const xpath_node& n) const
	{
		if (!_impl) return false;

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		bool r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_boolean(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return false;
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}